

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_metric.hpp
# Opt level: O0

size_t __thiscall
ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x03'>::my_hash<137UL>::
operator()(my_hash<137UL> *this,
          span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
          *s)

{
  bool bVar1;
  const_iterator this_00;
  reference pcVar2;
  char ch;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__range5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  iterator __end0;
  iterator __begin0;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  *__range4;
  uint hash;
  undefined7 in_stack_ffffffffffffffa8;
  char in_stack_ffffffffffffffaf;
  const_iterator in_stack_ffffffffffffffb0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffb8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>
  local_28 [2];
  uint local_14;
  
  local_14 = 0;
  local_28[0]._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
       ::begin((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  std::
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>::
  end((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
       *)in_stack_ffffffffffffffb8._M_current);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>
                        *)in_stack_ffffffffffffffb0._M_current,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>
                        *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>
    ::operator*(local_28);
    this_00 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    in_stack_ffffffffffffffb0 =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                   (this_00._M_current);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_ffffffffffffffb0._M_current,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&stack0xffffffffffffffb8);
      in_stack_ffffffffffffffaf = *pcVar2;
      local_14 = local_14 * 0x89 + (int)in_stack_ffffffffffffffaf;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&stack0xffffffffffffffb8);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>
    ::operator++(local_28);
  }
  return (ulong)local_14;
}

Assistant:

std::size_t operator()(
        const std::span<const std::string, N>& s) const noexcept {
      unsigned int hash = 0;
      for (const auto& str : s) {
        for (auto ch : str) {
          hash = hash * seed + ch;
        }
      }
      return hash;
    }